

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.h
# Opt level: O2

void __thiscall
InfoRecordInt::InfoRecordInt
          (InfoRecordInt *this,string *Xname,string *Xdescription,bool Xadvanced,
          HighsInt *Xvalue_pointer,HighsInt Xdefault_value)

{
  string sStack_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)Xname);
  std::__cxx11::string::string((string *)&sStack_68,(string *)Xdescription);
  InfoRecord::InfoRecord(&this->super_InfoRecord,kInt,&local_48,&sStack_68,Xadvanced);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_InfoRecord)._vptr_InfoRecord = (_func_int **)&PTR__InfoRecord_00432db0;
  this->value = Xvalue_pointer;
  this->default_value = Xdefault_value;
  *Xvalue_pointer = Xdefault_value;
  return;
}

Assistant:

InfoRecordInt(std::string Xname, std::string Xdescription, bool Xadvanced,
                HighsInt* Xvalue_pointer, HighsInt Xdefault_value)
      : InfoRecord(HighsInfoType::kInt, Xname, Xdescription, Xadvanced) {
    value = Xvalue_pointer;
    default_value = Xdefault_value;
    *value = default_value;
  }